

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O1

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  bool bVar1;
  undefined8 *in_RDX;
  undefined8 uVar2;
  char *__s;
  undefined8 uVar3;
  long in_FS_OFFSET;
  Status *result;
  Slice str;
  uint64_t number;
  int level;
  uint32_t tag;
  Slice input;
  uint32_t v;
  InternalKey key;
  FileMetaData f;
  Slice local_160;
  _Alloc_hider local_150;
  Slice local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  uint local_130;
  uint32_t local_12c;
  Slice local_128;
  undefined1 local_110 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  uint64_t local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  InternalKey local_b0;
  FileMetaData local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  src->size_ = 0;
  *src->data_ = '\0';
  *(undefined8 *)((long)&src[3].size_ + 5) = 0;
  src[3].data_ = (char *)0x0;
  src[3].size_ = 0;
  src[2].data_ = (char *)0x0;
  src[2].size_ = 0;
  std::
  _Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::clear((_Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           *)(src + 6));
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::_M_erase_at_end((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)(src + 9),(pointer)src[9].data_);
  local_128.data_ = (char *)*in_RDX;
  local_128.size_ = in_RDX[1];
  local_90.refs = 0;
  local_90.allowed_seeks = 0x40000000;
  local_90.file_size = 0;
  local_90.smallest.rep_._M_dataplus._M_p = (pointer)&local_90.smallest.rep_.field_2;
  local_90.smallest.rep_._M_string_length = 0;
  local_90.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_90.largest.rep_._M_dataplus._M_p = (pointer)&local_90.largest.rep_.field_2;
  local_90.largest.rep_._M_string_length = 0;
  local_90.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_148.data_ = "";
  local_148.size_ = 0;
  local_b0.rep_._M_dataplus._M_p = (pointer)&local_b0.rep_.field_2;
  local_b0.rep_._M_string_length = 0;
  local_b0.rep_.field_2._M_local_buf[0] = '\0';
  do {
    bVar1 = GetVarint32(&local_128,&local_12c);
    if (!bVar1) {
      __s = "invalid tag";
      if (local_128.size_ == 0) {
        __s = (char *)0x0;
      }
      break;
    }
    __s = "unknown tag";
    bVar1 = false;
    switch(local_12c) {
    case 1:
      bVar1 = GetLengthPrefixedSlice(&local_128,&local_148);
      if (bVar1) {
        local_110 = (undefined1  [8])&local_100;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,local_148.data_,local_148.data_ + local_148.size_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
        if (local_110 != (undefined1  [8])&local_100) {
          operator_delete((void *)local_110,local_100 + 1);
        }
        *(undefined1 *)&src[4].data_ = 1;
LAB_00d17e31:
        bVar1 = true;
        __s = (char *)0x0;
      }
      else {
        bVar1 = false;
        __s = "comparator name";
      }
      break;
    case 2:
      bVar1 = GetVarint64(&local_128,(uint64_t *)(src + 2));
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 1) = 1;
        goto LAB_00d17e31;
      }
      bVar1 = false;
      __s = "log number";
      break;
    case 3:
      bVar1 = GetVarint64(&local_128,(uint64_t *)(src + 3));
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 3) = 1;
        goto LAB_00d17e31;
      }
      bVar1 = false;
      __s = "next file number";
      break;
    case 4:
      bVar1 = GetVarint64(&local_128,&src[3].size_);
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 4) = 1;
        goto LAB_00d17e31;
      }
      bVar1 = false;
      __s = "last sequence number";
      break;
    case 5:
      bVar1 = GetVarint32(&local_128,(uint32_t *)local_110);
      if (bVar1 && (uint)local_110._0_4_ < 7) {
        local_130 = local_110._0_4_;
        bVar1 = GetInternalKey(&local_128,&local_b0);
        if (bVar1) {
          local_110._0_4_ = local_130;
          local_108 = &local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_b0.rep_._M_dataplus._M_p,
                     local_b0.rep_._M_dataplus._M_p + local_b0.rep_._M_string_length);
          std::
          vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
          ::emplace_back<std::pair<int,leveldb::InternalKey>>
                    ((vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
                      *)&src[4].size_,(pair<int,_leveldb::InternalKey> *)local_110);
          uVar2 = local_f8._M_allocated_capacity;
          uVar3 = local_108;
          if (local_108 != &local_f8) {
LAB_00d17d6c:
            operator_delete((void *)uVar3,uVar2 + 1);
          }
          goto LAB_00d17e31;
        }
      }
      bVar1 = false;
      __s = "compaction pointer";
      break;
    case 6:
      bVar1 = GetVarint32(&local_128,(uint32_t *)local_110);
      if (bVar1 && (uint)local_110._0_4_ < 7) {
        local_130 = local_110._0_4_;
        bVar1 = GetVarint64(&local_128,(uint64_t *)&local_138);
        if (bVar1) {
          local_110._0_4_ = local_130;
          local_108 = local_138;
          std::
          _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
          ::_M_insert_unique<std::pair<int,unsigned_long>>
                    ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                      *)(src + 6),(pair<int,_unsigned_long> *)local_110);
          goto LAB_00d17e31;
        }
      }
      bVar1 = false;
      __s = "deleted file";
      break;
    case 7:
      bVar1 = GetVarint32(&local_128,(uint32_t *)local_110);
      if (bVar1 && (uint)local_110._0_4_ < 7) {
        local_130 = local_110._0_4_;
        bVar1 = GetVarint64(&local_128,&local_90.number);
        if ((((bVar1) && (bVar1 = GetVarint64(&local_128,&local_90.file_size), bVar1)) &&
            (bVar1 = GetInternalKey(&local_128,&local_90.smallest), bVar1)) &&
           (bVar1 = GetInternalKey(&local_128,&local_90.largest), bVar1)) {
          std::pair<int,_leveldb::FileMetaData>::pair<int_&,_leveldb::FileMetaData_&,_true>
                    ((pair<int,_leveldb::FileMetaData> *)local_110,(int *)&local_130,&local_90);
          std::
          vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
          ::emplace_back<std::pair<int,leveldb::FileMetaData>>
                    ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                      *)(src + 9),(pair<int,_leveldb::FileMetaData> *)local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_p != &local_c0) {
            operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
          }
          uVar2 = local_e0._M_allocated_capacity;
          uVar3 = local_f8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._8_8_ != &local_e0) goto LAB_00d17d6c;
          goto LAB_00d17e31;
        }
      }
      bVar1 = false;
      __s = "new-file entry";
      break;
    case 8:
      break;
    case 9:
      bVar1 = GetVarint64(&local_128,&src[2].size_);
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 2) = 1;
        goto LAB_00d17e31;
      }
      bVar1 = false;
      __s = "previous log number";
      break;
    default:
      __s = "unknown tag";
      bVar1 = false;
    }
  } while (bVar1);
  (this->comparator_)._M_dataplus._M_p = (pointer)0x0;
  if (__s != (char *)0x0) {
    local_110 = (undefined1  [8])0x111d1a5;
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xb;
    local_160.data_ = __s;
    local_160.size_ = strlen(__s);
    Status::Status((Status *)&local_150,kCorruption,(Slice *)local_110,&local_160);
    (this->comparator_)._M_dataplus._M_p = local_150._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.rep_._M_dataplus._M_p != &local_b0.rep_.field_2) {
    operator_delete(local_b0.rep_._M_dataplus._M_p,
                    CONCAT71(local_b0.rep_.field_2._M_allocated_capacity._1_7_,
                             local_b0.rep_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.largest.rep_._M_dataplus._M_p != &local_90.largest.rep_.field_2) {
    operator_delete(local_90.largest.rep_._M_dataplus._M_p,
                    CONCAT71(local_90.largest.rep_.field_2._M_allocated_capacity._1_7_,
                             local_90.largest.rep_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.smallest.rep_._M_dataplus._M_p != &local_90.smallest.rep_.field_2) {
    operator_delete(local_90.smallest.rep_._M_dataplus._M_p,
                    CONCAT71(local_90.smallest.rep_.field_2._M_allocated_capacity._1_7_,
                             local_90.smallest.rep_.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}